

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O0

el_action_t ce_search_line(EditLine *el,wchar_t dir)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *pat;
  bool bVar3;
  wchar_t *ocp;
  wchar_t oc;
  wchar_t *pattern;
  wchar_t *cp;
  wchar_t dir_local;
  EditLine *el_local;
  
  pattern = (el->el_line).cursor;
  pat = (el->el_search).patbuf + 1;
  wVar1 = *pat;
  *pat = L'^';
  if (dir == L'\x18') {
    for (; (el->el_line).buffer <= pattern; pattern = pattern + -1) {
      wVar2 = el_match(pattern,pat);
      if (wVar2 != L'\0') {
        *pat = wVar1;
        (el->el_line).cursor = pattern;
        return '\0';
      }
    }
    *pat = wVar1;
    el_local._7_1_ = '\x06';
  }
  else {
    while( true ) {
      bVar3 = false;
      if (*pattern != L'\0') {
        bVar3 = pattern < (el->el_line).limit;
      }
      if (!bVar3) {
        *pat = wVar1;
        return '\x06';
      }
      wVar2 = el_match(pattern,pat);
      if (wVar2 != L'\0') break;
      pattern = pattern + 1;
    }
    *pat = wVar1;
    (el->el_line).cursor = pattern;
    el_local._7_1_ = '\0';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
ce_search_line(EditLine *el, int dir)
{
	wchar_t *cp = el->el_line.cursor;
	wchar_t *pattern = el->el_search.patbuf;
	wchar_t oc, *ocp;
#ifdef ANCHOR
	ocp = &pattern[1];
	oc = *ocp;
	*ocp = '^';
#else
	ocp = pattern;
	oc = *ocp;
#endif

	if (dir == ED_SEARCH_PREV_HISTORY) {
		for (; cp >= el->el_line.buffer; cp--) {
			if (el_match(cp, ocp)) {
				*ocp = oc;
				el->el_line.cursor = cp;
				return CC_NORM;
			}
		}
		*ocp = oc;
		return CC_ERROR;
	} else {
		for (; *cp != '\0' && cp < el->el_line.limit; cp++) {
			if (el_match(cp, ocp)) {
				*ocp = oc;
				el->el_line.cursor = cp;
				return CC_NORM;
			}
		}
		*ocp = oc;
		return CC_ERROR;
	}
}